

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

void __thiscall
docopt::Option::Option(Option *this,string *shortOption,string *longOption,int argcount,value *v)

{
  pointer *ppbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  pointer pbVar5;
  undefined8 uVar6;
  string *psVar7;
  undefined1 local_a8 [8];
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  char local_70 [16];
  undefined1 local_60 [8];
  Variant local_58;
  int local_34;
  
  psVar7 = longOption;
  if (longOption->_M_string_length == 0) {
    psVar7 = shortOption;
  }
  local_80._M_allocated_capacity = (size_type)local_70;
  pcVar4 = (psVar7->_M_dataplus)._M_p;
  local_34 = argcount;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar4,pcVar4 + psVar7->_M_string_length);
  local_60._0_4_ = v->kind;
  switch(local_60._0_4_) {
  case 1:
    local_58.boolValue = (v->variant).boolValue;
    break;
  case 2:
    local_58.longValue =
         (long)(v->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    break;
  case 3:
    local_58.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&local_58.strValue + 0x10);
    pbVar5 = (v->variant).strList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppbVar1 = &(v->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pbVar5 == (pointer)ppbVar1) {
      local_58.strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *ppbVar1;
      local_58._24_8_ = *(undefined8 *)((long)&v->variant + 0x18);
    }
    else {
      local_58.strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *ppbVar1;
      local_58.longValue = (long)pbVar5;
    }
    local_58.strValue._M_string_length = (v->variant).strValue._M_string_length;
    (v->variant).strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    (v->variant).strValue._M_string_length = 0;
    *(undefined1 *)((long)&v->variant + 0x10) = 0;
    break;
  case 4:
    local_58.longValue =
         (long)(v->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_58.strValue._M_string_length = (v->variant).strValue._M_string_length;
    local_58.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (v->variant).strList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (v->variant).longValue = 0;
    (v->variant).strValue._M_string_length = 0;
    (v->variant).strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  LeafPattern::LeafPattern(&this->super_LeafPattern,(string *)&local_80,(value *)local_60);
  if (local_60._0_4_ == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
  }
  else if ((local_60._0_4_ == String) && (local_58.longValue != (long)&local_58.strValue + 0x10)) {
    operator_delete(local_58.strList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char *)local_80._M_allocated_capacity != local_70) {
    operator_delete((void *)local_80._M_allocated_capacity);
  }
  (this->super_LeafPattern).super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_0019b3d8;
  paVar2 = &(this->fShortOption).field_2;
  (this->fShortOption)._M_dataplus._M_p = (pointer)paVar2;
  pcVar4 = (shortOption->_M_dataplus)._M_p;
  paVar3 = &shortOption->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar3) {
    uVar6 = *(undefined8 *)((long)&shortOption->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar3->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fShortOption).field_2 + 8) = uVar6;
  }
  else {
    (this->fShortOption)._M_dataplus._M_p = pcVar4;
    (this->fShortOption).field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  (this->fShortOption)._M_string_length = shortOption->_M_string_length;
  (shortOption->_M_dataplus)._M_p = (pointer)paVar3;
  shortOption->_M_string_length = 0;
  (shortOption->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->fLongOption).field_2;
  (this->fLongOption)._M_dataplus._M_p = (pointer)paVar2;
  pcVar4 = (longOption->_M_dataplus)._M_p;
  paVar3 = &longOption->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar3) {
    uVar6 = *(undefined8 *)((long)&longOption->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar3->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fLongOption).field_2 + 8) = uVar6;
  }
  else {
    (this->fLongOption)._M_dataplus._M_p = pcVar4;
    (this->fLongOption).field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  (this->fLongOption)._M_string_length = longOption->_M_string_length;
  (longOption->_M_dataplus)._M_p = (pointer)paVar3;
  longOption->_M_string_length = 0;
  (longOption->field_2)._M_local_buf[0] = '\0';
  this->fArgcount = local_34;
  if (((local_34 != 0) && (v->kind == Bool)) &&
     (value::throwIfNotKind(v,Bool), (v->variant).boolValue == false)) {
    local_a8._0_4_ = Empty;
    LeafPattern::setValue(&this->super_LeafPattern,(value *)local_a8);
    if (local_a8._0_4_ == StringList) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a0);
    }
    else if ((local_a8._0_4_ == String) && ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)))
    {
      operator_delete((void *)local_a0._0_8_);
    }
  }
  return;
}

Assistant:

Option(std::string shortOption,
		       std::string longOption,
		       int argcount = 0,
		       value v = value{false})
		: LeafPattern(longOption.empty() ? shortOption : longOption,
			      std::move(v)),
		  fShortOption(std::move(shortOption)),
		  fLongOption(std::move(longOption)),
		  fArgcount(argcount)
		{
			// From Python:
			//   self.value = None if value is False and argcount else value
			if (argcount && v.isBool() && !v.asBool()) {
				setValue(value{});
			}
		}